

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix.cc
# Opt level: O1

void helix_session_set_send_callback(helix_session_t session,helix_send_callback_t callback)

{
  helix_session_t local_28;
  helix_send_callback_t p_Stack_20;
  code *local_18;
  code *pcStack_10;
  
  pcStack_10 = std::
               _Function_handler<void_(char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jvirtanen[P]helix/src/helix.cc:109:40)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jvirtanen[P]helix/src/helix.cc:109:40)>
             ::_M_manager;
  local_28 = session;
  p_Stack_20 = callback;
  (**(code **)(*(long *)session + 0x28))(session,&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
  }
  return;
}

Assistant:

void helix_session_set_send_callback(helix_session_t session, helix_send_callback_t callback)
{
    unwrap(session)->set_send_callback([session, callback](char* base, size_t len) {
        callback(session, base, len);
    });
}